

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O1

void log_ERR_get_error(char *message)

{
  LOGGER_LOG p_Var1;
  ulong e;
  char *pcVar2;
  ulong uVar3;
  char buf [128];
  
  if (message != (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/x509_openssl.c"
                ,"log_ERR_get_error",0x21,1,"%s",message);
    }
  }
  e = ERR_get_error();
  if (e != 0) {
    uVar3 = 0;
    do {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar2 = ERR_error_string(e,buf);
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/x509_openssl.c"
                  ,"log_ERR_get_error",0x28,1,"  [%d] %s",uVar3,pcVar2);
      }
      e = ERR_get_error();
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (e != 0);
  }
  return;
}

Assistant:

static void log_ERR_get_error(const char* message)
{
    char buf[128];
    AZURE_UNREFERENCED_PARAMETER(buf);
    unsigned long error;
    int i;

    if (message != NULL)
    {
        LogError("%s", message);
    }

    error = ERR_get_error();

    for (i = 0; 0 != error; i++)
    {
        LogError("  [%d] %s", i, ERR_error_string(error, buf));
        error = ERR_get_error();
    }
}